

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

void capnp::_::WireHelpers::adopt
               (SegmentBuilder *segment,CapTableBuilder *capTable,WirePointer *ref,
               OrphanBuilder *value)

{
  Fault f;
  Fault local_20;
  
  if ((value->segment != (SegmentBuilder *)0x0) &&
     ((value->segment->super_SegmentReader).arena != (segment->super_SegmentReader).arena)) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[46]>
              (&local_20,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
               ,0x822,FAILED,
               "value.segment == nullptr || value.segment->getArena() == segment->getArena()",
               "\"Adopted object must live in the same message.\"",
               (char (*) [46])"Adopted object must live in the same message.");
    kj::_::Debug::Fault::fatal(&local_20);
  }
  if ((ref->field_1).upper32Bits != 0 || (ref->offsetAndKind).value != 0) {
    zeroObject(segment,capTable,ref);
  }
  if (value->location == (word *)0x0) {
    ref->offsetAndKind = 0;
    ref->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
  }
  else if (((value->tag).content & 2) == 0) {
    transferPointer(segment,ref,value->segment,(WirePointer *)value,value->location);
  }
  else {
    *ref = (WirePointer)(value->tag).content;
  }
  value->location = (word *)0x0;
  (value->tag).content = 0;
  value->segment = (SegmentBuilder *)0x0;
  return;
}

Assistant:

static void adopt(SegmentBuilder* segment, CapTableBuilder* capTable,
                    WirePointer* ref, OrphanBuilder&& value) {
    KJ_REQUIRE(value.segment == nullptr || value.segment->getArena() == segment->getArena(),
               "Adopted object must live in the same message.");

    if (!ref->isNull()) {
      zeroObject(segment, capTable, ref);
    }

    if (value == nullptr) {
      // Set null.
      zeroMemory(ref);
    } else if (value.tagAsPtr()->isPositional()) {
      WireHelpers::transferPointer(segment, ref, value.segment, value.tagAsPtr(), value.location);
    } else {
      // FAR and OTHER pointers are position-independent, so we can just copy.
      copyMemory(ref, value.tagAsPtr());
    }

    // Take ownership away from the OrphanBuilder.
    zeroMemory(value.tagAsPtr());
    value.location = nullptr;
    value.segment = nullptr;
  }